

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

int __thiscall
google::protobuf::internal::EpsCopyInputStream::BytesAvailable(EpsCopyInputStream *this,char *ptr)

{
  Nonnull<const_char_*> pcVar1;
  char *v1;
  
  if (ptr == (char *)0x0) {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<char_const*,void_const*>
                       ((char *)0x0,(void *)0x0,"ptr != nullptr");
  }
  else {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    v1 = this->buffer_end_ + (0x10 - (long)ptr);
    if ((long)v1 < 0) {
      pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)v1,0,"available >= 0");
    }
    else {
      pcVar1 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar1 == (Nonnull<const_char_*>)0x0) {
      if ((long)v1 < 0x80000000) {
        pcVar1 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           ((long)v1,0x7fffffff,"available <= INT_MAX");
      }
      if (pcVar1 == (Nonnull<const_char_*>)0x0) {
        return (int)v1;
      }
      goto LAB_0024b891;
    }
  }
  else {
    BytesAvailable();
  }
  BytesAvailable();
LAB_0024b891:
  BytesAvailable();
}

Assistant:

int BytesAvailable(const char* ptr) const {
    ABSL_DCHECK_NE(ptr, nullptr);
    ptrdiff_t available = buffer_end_ + kSlopBytes - ptr;
    ABSL_DCHECK_GE(available, 0);
    ABSL_DCHECK_LE(available, INT_MAX);
    return static_cast<int>(available);
  }